

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

bool __thiscall RigidBodyDynamics::ConstraintSet::Bind(ConstraintSet *this,Model *model)

{
  undefined8 uVar1;
  ulong uVar2;
  size_type sVar3;
  element_type *peVar4;
  size_t sVar5;
  allocator_type *__a;
  long in_RSI;
  long in_RDI;
  uint n_constr;
  uint i;
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff948;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *other;
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff950;
  Vector3_t *this_00;
  Index in_stack_fffffffffffff958;
  Index in_stack_fffffffffffff960;
  value_type *__value;
  string *in_stack_fffffffffffff968;
  undefined1 *__n;
  RBDLError *in_stack_fffffffffffff970;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *this_01;
  size_type in_stack_fffffffffffff978;
  allocator<char> *in_stack_fffffffffffff980;
  value_type *val;
  char *in_stack_fffffffffffff988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff990;
  vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_> *this_02;
  EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *in_stack_fffffffffffff9a8
  ;
  HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff9b0;
  undefined1 local_4c1;
  undefined1 local_4c0 [64];
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_480 [24];
  undefined1 local_468 [64];
  undefined1 local_428 [344];
  vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_> local_2d0 [21];
  non_const_type local_d0;
  undefined4 local_6c;
  uint local_4c;
  undefined1 local_45;
  long local_10;
  
  if ((*(byte *)(in_RDI + 4) & 1) != 0) {
    local_45 = 1;
    uVar1 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980);
    Errors::RBDLError::RBDLError(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_45 = 0;
    __cxa_throw(uVar1,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  local_4c = 0;
  local_10 = in_RSI;
  while( true ) {
    uVar2 = (ulong)local_4c;
    sVar3 = std::
            vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
            ::size((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                    *)(in_RDI + 200));
    if (sVar3 <= uVar2) break;
    std::
    vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
    ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                  *)(in_RDI + 200),(ulong)local_4c);
    peVar4 = std::
             __shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<RigidBodyDynamics::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x6d57a2);
    (**peVar4->_vptr_Constraint)(peVar4,local_10);
    local_4c = local_4c + 1;
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_fffffffffffff958);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff950,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffff948);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff970,
             (Index)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff970,
             (Index)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff970,
             (Index)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff970,
             (Index)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff970
             ,(Index)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff970
             ,(Index)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff970
             ,(Index)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff970
             ,(Index)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff970
             ,(Index)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff970
             ,(Index)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff970
             ,(Index)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff970
             ,(Index)in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  sVar5 = size((ConstraintSet *)0x6d5a0b);
  local_6c = (undefined4)sVar5;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff950
             ,(Index)in_stack_fffffffffffff948,0x6d5a3e);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff950);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950,
             (Index)in_stack_fffffffffffff948);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950,
             (Index)in_stack_fffffffffffff948);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff950
             ,(Index)in_stack_fffffffffffff948,0x6d5ae5);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff950);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff950
             ,(Index)in_stack_fffffffffffff948,0x6d5b27);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff950);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950,
             (Index)in_stack_fffffffffffff948);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950,
             (Index)in_stack_fffffffffffff948);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff950
             ,(Index)in_stack_fffffffffffff948,0x6d5bde);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff950);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff950
             ,(Index)in_stack_fffffffffffff948,0x6d5c0f);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            (in_stack_fffffffffffff978,(Index)in_stack_fffffffffffff970);
  local_d0 = (non_const_type)
             Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                       ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        in_stack_fffffffffffff948);
  Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  HouseholderQR<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator=
            (in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
            (in_stack_fffffffffffff950);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (in_stack_fffffffffffff958,(Index)in_stack_fffffffffffff950);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_fffffffffffff950->m_qr,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffff948);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x6d5ce8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (in_stack_fffffffffffff958,(Index)in_stack_fffffffffffff950);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_fffffffffffff950->m_qr,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffff948);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x6d5d44);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (in_stack_fffffffffffff958,(Index)in_stack_fffffffffffff950);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (&in_stack_fffffffffffff950->m_qr,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffff948);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_fffffffffffff958);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff950,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffff948);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_fffffffffffff958);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff950,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffff948);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff950
             ,(Index)in_stack_fffffffffffff948,0x6d5e27);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff950);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950,
             (Index)in_stack_fffffffffffff948);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950,
             (Index)in_stack_fffffffffffff948);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::Zero();
  SpatialVector_t::
  SpatialVector_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>>>
            ((SpatialVector_t *)in_stack_fffffffffffff950,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)in_stack_fffffffffffff948);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff980,in_stack_fffffffffffff978,
             (value_type *)in_stack_fffffffffffff970);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)in_stack_fffffffffffff950,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffff948);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::resize
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_stack_fffffffffffff980,
             in_stack_fffffffffffff978,(value_type *)in_stack_fffffffffffff970);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950,
             (Index)in_stack_fffffffffffff948);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff950);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x338));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::Zero();
  SpatialVector_t::
  SpatialVector_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>>>
            ((SpatialVector_t *)in_stack_fffffffffffff950,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)in_stack_fffffffffffff948);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff980,in_stack_fffffffffffff978,
             (value_type *)in_stack_fffffffffffff970);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x338));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::Zero();
  SpatialVector_t::
  SpatialVector_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>>>
            ((SpatialVector_t *)in_stack_fffffffffffff950,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)in_stack_fffffffffffff948);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff990,
             (size_type)in_stack_fffffffffffff988,(value_type *)in_stack_fffffffffffff980);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::operator=
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff950,
             (vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff948)
  ;
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::~vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)0x6d60d9);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x338));
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::Zero();
  SpatialVector_t::
  SpatialVector_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>>>
            ((SpatialVector_t *)in_stack_fffffffffffff950,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)in_stack_fffffffffffff948);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff990,
             (size_type)in_stack_fffffffffffff988,(value_type *)in_stack_fffffffffffff980);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::operator=
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff950,
             (vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff948)
  ;
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::~vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)0x6d616b);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x338));
  this_02 = local_2d0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_fffffffffffff958);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff950,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffff948);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x338));
  Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
  SpatialMatrix_t::
  SpatialMatrix_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
            ((SpatialMatrix_t *)in_stack_fffffffffffff950,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
              *)in_stack_fffffffffffff948);
  std::vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_>::vector
            (this_02,(size_type)in_stack_fffffffffffff988,(value_type *)in_stack_fffffffffffff980);
  std::vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_>::operator=
            ((vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_> *)in_stack_fffffffffffff950,
             (vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_> *)in_stack_fffffffffffff948)
  ;
  std::vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_>::~vector
            ((vector<SpatialMatrix_t,_std::allocator<SpatialMatrix_t>_> *)0x6d6233);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x338));
  this_01 = (vector<Vector3_t,_std::allocator<Vector3_t>_> *)local_468;
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::Zero();
  val = (value_type *)(local_468 + 0x10);
  SpatialVector_t::
  SpatialVector_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>>>
            ((SpatialVector_t *)in_stack_fffffffffffff950,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)in_stack_fffffffffffff948);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)this_02,
             (size_type)local_428,val);
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::operator=
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff950,
             (vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)in_stack_fffffffffffff948)
  ;
  std::vector<SpatialVector_t,_std::allocator<SpatialVector_t>_>::~vector
            ((vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)0x6d62b9);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x338));
  other = local_480;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(in_stack_fffffffffffff958);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff950,other);
  __a = (allocator_type *)
        std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
        size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (local_10 + 0x338));
  this_00 = (Vector3_t *)local_4c0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  __value = (value_type *)(local_4c0 + 0x10);
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            (this_00,(MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)other);
  __n = &local_4c1;
  std::allocator<Vector3_t>::allocator((allocator<Vector3_t> *)0x6d634d);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector(this_01,(size_type)__n,__value,__a);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator=
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)__value,
             (vector<Vector3_t,_std::allocator<Vector3_t>_> *)__a);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::~vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)__value);
  std::allocator<Vector3_t>::~allocator((allocator<Vector3_t> *)0x6d63a1);
  *(undefined1 *)(in_RDI + 4) = 1;
  return (bool)(*(byte *)(in_RDI + 4) & 1);
}

Assistant:

bool ConstraintSet::Bind (const Model &model)
{
  assert (bound == false);

  if (bound) {
    throw Errors::RBDLError("Error: binding an already bound constraint set!\n");
  }
  for(unsigned int i=0; i<constraints.size(); ++i) {
    constraints[i]->bind(model);
  }

  cache.vecNZeros = VectorNd::Zero(model.qdot_size);
  cache.vecNA.resize(model.qdot_size,1);
  cache.vecNB.resize(model.qdot_size,1);
  cache.vecNC.resize(model.qdot_size,1);
  cache.vecND.resize(model.qdot_size,1);

  cache.mat3NA.resize(3, model.qdot_size);
  cache.mat3NB.resize(3, model.qdot_size);
  cache.mat3NC.resize(3, model.qdot_size);
  cache.mat3ND.resize(3, model.qdot_size);

  cache.mat6NA.resize(6, model.qdot_size);
  cache.mat6NB.resize(6, model.qdot_size);
  cache.mat6NC.resize(6, model.qdot_size);
  cache.mat6ND.resize(6, model.qdot_size);


  unsigned int n_constr = size();

  H.conservativeResize (model.dof_count, model.dof_count);
  H.setZero();
  C.conservativeResize (model.dof_count);
  C.setZero();
  gamma.conservativeResize (n_constr);
  gamma.setZero();
  G.conservativeResize (n_constr, model.dof_count);
  G.setZero();
  A.conservativeResize (model.dof_count + n_constr, model.dof_count + n_constr);
  A.setZero();
  b.conservativeResize (model.dof_count + n_constr);
  b.setZero();
  x.conservativeResize (model.dof_count + n_constr);
  x.setZero();


  S.conservativeResize(model.dof_count, model.dof_count);
  S.setZero();
  W.conservativeResize(model.dof_count, model.dof_count);
  W.Identity(model.dof_count, model.dof_count);

  // HouseHolderQR crashes if matrix G has more rows than columns.
#ifndef RBDL_USE_CASADI_MATH
  GT_qr = Eigen::HouseholderQR<Math::MatrixNd> (G.transpose());
#endif
  GT_qr_Q = MatrixNd::Zero (model.dof_count, model.dof_count);
  Y = MatrixNd::Zero (model.dof_count, G.rows());
  Z = MatrixNd::Zero (model.dof_count, model.dof_count - G.rows());
  qddot_y = VectorNd::Zero (model.dof_count);
  qddot_z = VectorNd::Zero (model.dof_count);

  K.conservativeResize (n_constr, n_constr);
  K.setZero();
  a.conservativeResize (n_constr);
  a.setZero();
  QDDot_t.conservativeResize (model.dof_count);
  QDDot_t.setZero();
  f_t.resize (n_constr, SpatialVector::Zero());
  point_accel_0.resize (n_constr, Vector3d::Zero());

  QDDot_0.conservativeResize (model.dof_count);
  QDDot_0.setZero();


  f_ext_constraints.resize (model.mBodies.size(), SpatialVector::Zero());


  d_pA =std::vector<SpatialVector> (model.mBodies.size(),SpatialVector::Zero());
  d_a = std::vector<SpatialVector> (model.mBodies.size(),SpatialVector::Zero());
  d_u = VectorNd::Zero (model.mBodies.size());

  d_IA = std::vector<SpatialMatrix> (model.mBodies.size()
                                     , SpatialMatrix::Identity());
  d_U = std::vector<SpatialVector> (model.mBodies.size(),SpatialVector::Zero());
  d_d = VectorNd::Zero (model.mBodies.size());

  d_multdof3_u = std::vector<Math::Vector3d> (model.mBodies.size()
                 , Math::Vector3d::Zero());

  bound = true;

  return bound;
}